

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptReflect.cpp
# Opt level: O2

Var Js::JavascriptReflect::EntrySet(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  JavascriptBoolean *pJVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  Var pvVar8;
  RecyclableObject *index;
  RecyclableObject *value;
  Var receiver;
  RecyclableObject *pRVar9;
  int32 hCode;
  int in_stack_00000010;
  undefined1 local_78 [8];
  AutoTagNativeLibraryEntry __tag;
  CallInfo callInfo_local;
  undefined1 local_40 [8];
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  __tag.entry.next = (Entry *)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0x116,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00bad896;
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_40,(CallInfo *)&__tag.entry.next,(Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  value = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
          undefinedValue.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_78,function,(CallInfo)__tag.entry.next,
             L"Reflect.set",&stack0x00000000);
  uVar5 = local_40._0_4_;
  if (((ulong)local_40 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0x11b,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar4) {
LAB_00bad896:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
    uVar5 = local_40._0_4_;
  }
  if ((uVar5 >> 0x18 & 1) == 0) {
    hCode = -0x7ff5ec36;
    if ((uVar5 & 0xfffffe) != 0) {
      pvVar8 = Arguments::operator[]((Arguments *)local_40,1);
      BVar6 = JavascriptOperators::IsObject(pvVar8);
      if (BVar6 != 0) {
        pvVar8 = Arguments::operator[]((Arguments *)local_40,1);
        index = value;
        if (2 < (local_40._0_4_ & 0xffffff)) {
          index = (RecyclableObject *)Arguments::operator[]((Arguments *)local_40,2);
        }
        if (((ulong)local_40 & 0xfffffc) != 0) {
          value = (RecyclableObject *)Arguments::operator[]((Arguments *)local_40,3);
        }
        receiver = pvVar8;
        if (4 < (local_40._0_4_ & 0xffffff)) {
          receiver = Arguments::operator[]((Arguments *)local_40,4);
        }
        pRVar9 = JavascriptOperators::ToObject(pvVar8,pSVar1);
        pRVar9 = VarTo<Js::RecyclableObject>(pRVar9);
        BVar6 = JavascriptOperators::SetElementIHelper
                          (receiver,pRVar9,index,value,pSVar1,PropertyOperation_None);
        pJVar2 = (&(((pSVar1->super_ScriptContextBase).javascriptLibrary)->
                   super_JavascriptLibraryBase).booleanTrue)[BVar6 == 0].ptr;
        AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_78)
        ;
        return pJVar2;
      }
    }
  }
  else {
    hCode = -0x7ff5ebf5;
  }
  JavascriptError::ThrowTypeError(pSVar1,hCode,L"Reflect.set");
}

Assistant:

Var JavascriptReflect::EntrySet(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        Var undefinedValue = scriptContext->GetLibrary()->GetUndefined();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Reflect.set"));

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        if (args.Info.Flags & CallFlags_New)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ErrorOnNew, _u("Reflect.set"));
        }

        if (args.Info.Count < 2 || !JavascriptOperators::IsObject(args[1]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("Reflect.set"));
        }
        Var target = args[1];
        Var propertyKey = args.Info.Count > 2 ? args[2] : undefinedValue;
        Var value = args.Info.Count > 3 ? args[3] : undefinedValue;
        Var receiver = args.Info.Count > 4 ? args[4] : target;

        target = JavascriptOperators::ToObject(target, scriptContext);
        BOOL result = JavascriptOperators::SetElementIHelper(receiver, VarTo<RecyclableObject>(target), propertyKey, value, scriptContext, PropertyOperationFlags::PropertyOperation_None);
        return scriptContext->GetLibrary()->GetTrueOrFalse(result);
    }